

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_EraseDoesNotResize_Test<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator f;
  iterator l;
  bool bVar1;
  Message *message;
  char *pcVar2;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  int i_1;
  size_type old_count;
  int i;
  key_type *in_stack_fffffffffffffe28;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe30;
  uint *in_stack_fffffffffffffe38;
  HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  int line;
  char *in_stack_fffffffffffffe50;
  undefined8 in_stack_fffffffffffffe58;
  Type type;
  AssertHelper *in_stack_fffffffffffffe60;
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe70;
  Message *in_stack_fffffffffffffea8;
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffec0 [16];
  pointer in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  AssertionResult in_stack_fffffffffffffee0;
  char *local_110;
  char *local_108;
  char *local_100;
  AssertHelper *local_d0;
  unsigned_long *local_c8;
  AssertionResult local_68;
  int local_54;
  size_type local_50;
  value_type local_20;
  int local_14;
  key_type local_10;
  
  local_10 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  for (local_14 = 10; local_14 < 2000; local_14 = local_14 + 1) {
    local_20 = HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
               ::UniqueObject(in_stack_fffffffffffffe30,
                              (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
  }
  local_50 = google::
             BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket_count((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                             *)0xecc094);
  for (local_54 = 10; type = (Type)((ulong)in_stack_fffffffffffffe58 >> 0x20), local_54 < 1000;
      local_54 = local_54 + 1) {
    HashtableTest<google::HashtableInterface_DenseHashtable<const_char_*,_const_char_*,_kEmptyCharStar,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
    ::UniqueKey(in_stack_fffffffffffffe40,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20));
    google::
    BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
              (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38
               ,(unsigned_long *)in_stack_fffffffffffffe30);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe60);
      in_stack_fffffffffffffe70 =
           (BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xecc161);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_fffffffffffffe60,(Type)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 in_stack_fffffffffffffe50,(int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 (char *)in_stack_fffffffffffffe40);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe30);
      testing::Message::~Message((Message *)0xecc1be);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xecc229);
  }
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffe70);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffe70);
  f.end = in_stack_fffffffffffffed0;
  f.ht = (dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffec0._0_8_;
  f.pos = (pointer)in_stack_fffffffffffffec0._8_8_;
  l.ht._4_4_ = in_stack_fffffffffffffedc;
  l.ht._0_4_ = in_stack_fffffffffffffed8;
  l._8_16_ = in_stack_fffffffffffffee0;
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffeb0,f,l);
  google::
  BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xecc34f);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_108,local_110,(uint *)local_c8,(unsigned_long *)local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffee0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    in_stack_fffffffffffffe60 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xecc3b6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,type,local_100,(int)((ulong)local_108 >> 0x20),local_110);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    testing::Message::~Message((Message *)0xecc413);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xecc481);
  message = (Message *)
            google::
            BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_count((BaseHashtableInterface<google::dense_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<ValueType,_unsigned_long,_18446744073709551615UL>_>_>
                            *)0xecc48f);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            (local_108,local_110,local_c8,(unsigned_long *)local_d0);
  line = (int)((ulong)local_108 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffeb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe60);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xecc505);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe60,(Type)((ulong)pcVar2 >> 0x20),local_100,line,local_110);
    testing::internal::AssertHelper::operator=((AssertHelper *)in_stack_fffffffffffffeb0,message);
    testing::internal::AssertHelper::~AssertHelper(local_d0);
    testing::Message::~Message((Message *)0xecc553);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xecc5b8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, EraseDoesNotResize) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  for (int i = 10; i < 2000; i++) {
    this->ht_.insert(this->UniqueObject(i));
  }
  const typename TypeParam::size_type old_count = this->ht_.bucket_count();
  for (int i = 10; i < 1000; i++) {  // erase half one at a time
    EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(i)));
  }
  this->ht_.erase(this->ht_.begin(), this->ht_.end());  // and the rest at once
  EXPECT_EQ(0u, this->ht_.size());
  EXPECT_EQ(old_count, this->ht_.bucket_count());
}